

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::OP_HasItem(Var instance,Var index,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  IndexType IVar3;
  BOOL BVar4;
  DynamicObject *instance_00;
  Var indexVar;
  undefined4 *puVar5;
  JavascriptString *propertyString;
  PropertyRecord *local_40;
  PropertyRecord *debugPropertyRecord;
  PropertyRecord *propertyRecord;
  uint32 indexVal;
  
  bVar2 = VarIs<Js::RecyclableObject>(instance);
  if (bVar2) {
    instance_00 = (DynamicObject *)VarTo<Js::RecyclableObject>(instance);
  }
  else {
    instance_00 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                  super_JavascriptLibraryBase).numberPrototype.ptr;
  }
  debugPropertyRecord = (PropertyRecord *)0x0;
  indexVar = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)1>(index,scriptContext);
  IVar3 = GetIndexTypeFromPrimitive
                    (indexVar,scriptContext,(uint32 *)((long)&propertyRecord + 4),
                     &debugPropertyRecord,(JavascriptString **)0x0,false,false);
  if (IVar3 != IndexType_PropertyId) {
    if (IVar3 == IndexType_Number) {
      BVar4 = HasItem(&instance_00->super_RecyclableObject,propertyRecord._4_4_);
      return BVar4;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xde0,"(indexType == IndexType_PropertyId)",
                                "indexType == IndexType_PropertyId");
    if (!bVar2) goto LAB_00aacf26;
    *puVar5 = 0;
  }
  if (debugPropertyRecord == (PropertyRecord *)0x0) {
    bVar2 = CanShortcutOnUnknownPropertyName(&instance_00->super_RecyclableObject);
    if (!bVar2) {
      IVar3 = GetIndexTypeFromPrimitive
                        (indexVar,scriptContext,(uint32 *)((long)&propertyRecord + 4),
                         &debugPropertyRecord,(JavascriptString **)0x0,true,false);
      if (IVar3 != IndexType_PropertyId) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0xde4,"(indexType == IndexType_PropertyId)",
                                    "indexType == IndexType_PropertyId");
        if (!bVar2) goto LAB_00aacf26;
        *puVar5 = 0;
      }
      if (debugPropertyRecord != (PropertyRecord *)0x0) goto LAB_00aace88;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0xde5,"(propertyRecord != nullptr)","propertyRecord != nullptr");
      if (!bVar2) goto LAB_00aacf26;
      *puVar5 = 0;
    }
    if (debugPropertyRecord == (PropertyRecord *)0x0) {
      propertyString = JavascriptConversion::ToString(indexVar,scriptContext);
      ScriptContext::GetOrAddPropertyRecord(scriptContext,propertyString,&local_40);
      BVar4 = HasProperty(&instance_00->super_RecyclableObject,local_40->pid);
      if (BVar4 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0xdf2,
                                    "(!JavascriptOperators::HasProperty(object, debugPropertyRecord->GetPropertyId()))"
                                    ,
                                    "how did this property come? See OS Bug 2727708 if you see this come from the web"
                                   );
        if (!bVar2) {
LAB_00aacf26:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      return 0;
    }
  }
LAB_00aace88:
  BVar4 = HasProperty(&instance_00->super_RecyclableObject,debugPropertyRecord->pid);
  return BVar4;
}

Assistant:

BOOL JavascriptOperators::OP_HasItem(Var instance, Var index, ScriptContext* scriptContext)
    {
        RecyclableObject* object = TaggedNumber::Is(instance) ?
            scriptContext->GetLibrary()->GetNumberPrototype() :
            VarTo<RecyclableObject>(instance);

        uint32 indexVal;
        PropertyRecord const * propertyRecord = nullptr;
        IndexType indexType = GetIndexType(index, scriptContext, &indexVal, &propertyRecord, false);

        if (indexType == IndexType_Number)
        {
            return HasItem(object, indexVal);
        }
        else
        {
            Assert(indexType == IndexType_PropertyId);
            if (propertyRecord == nullptr && !JavascriptOperators::CanShortcutOnUnknownPropertyName(object))
            {
                indexType = GetIndexTypeFromPrimitive(index, scriptContext, &indexVal, &propertyRecord, true);
                Assert(indexType == IndexType_PropertyId);
                Assert(propertyRecord != nullptr);
            }

            if (propertyRecord != nullptr)
            {
                return HasProperty(object, propertyRecord->GetPropertyId());
            }
            else
            {
#if DBG
                JavascriptString* indexStr = JavascriptConversion::ToString(index, scriptContext);
                PropertyRecord const * debugPropertyRecord;
                scriptContext->GetOrAddPropertyRecord(indexStr, &debugPropertyRecord);
                AssertMsg(!JavascriptOperators::HasProperty(object, debugPropertyRecord->GetPropertyId()), "how did this property come? See OS Bug 2727708 if you see this come from the web");
#endif

                return FALSE;
            }
        }
    }